

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  allocator local_59;
  string local_58;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf;
  cmExtraKateGenerator *this_local;
  
  mf = (cmMakefile *)this;
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_01,0);
  local_18 = cmLocalGenerator::GetMakefile(*ppcVar2);
  pcVar3 = cmMakefile::GetProjectName(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,pcVar3,&local_59);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_BUILD_TYPE",&local_b1);
  pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,pcVar3,&local_b2);
  pcVar3 = cmMakefile::GetHomeOutputDirectory(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,pcVar3,&local_f9);
  GetPathBasename(&local_d8,this,&local_f8);
  GenerateProjectName(&local_38,this,&local_58,&local_90,&local_d8);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b2);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[2])
            ();
  bVar1 = std::operator==(&local_120,"Ninja");
  this->UseNinja = bVar1;
  std::__cxx11::string::~string((string *)&local_120);
  CreateKateProjectFile(this,local_18);
  CreateDummyKateProjectFile(this,local_18);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  const cmMakefile* mf
     = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  this->ProjectName = this->GenerateProjectName(mf->GetProjectName(),
                          mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                          this->GetPathBasename(mf->GetHomeOutputDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(mf);
  this->CreateDummyKateProjectFile(mf);
}